

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bignum-dtoa.cc
# Opt level: O3

void TestBignumDtoaShortestVariousFloats(void)

{
  char *pcVar1;
  undefined8 uVar2;
  char *pcVar3;
  undefined8 uVar4;
  Vector<char> buffer;
  Vector<char> buffer_00;
  Vector<char> buffer_01;
  Vector<char> buffer_02;
  Vector<char> buffer_03;
  Vector<char> buffer_04;
  Vector<char> buffer_05;
  Vector<char> buffer_06;
  Vector<char> buffer_07;
  Vector<char> buffer_08;
  int point;
  int length;
  char buffer_container [100];
  int *in_stack_ffffffffffffff78;
  undefined8 uVar5;
  int local_80;
  undefined1 local_7c [4];
  short local_78;
  undefined1 uStack_76;
  undefined1 uStack_75;
  short sStack_74;
  undefined1 uStack_72;
  undefined1 uStack_71;
  char local_70;
  
  buffer._8_8_ = local_7c;
  buffer.start_ = (char *)0x64;
  double_conversion::BignumDtoa
            ((double_conversion *)0x1,1.401298464324817e-45,BIGNUM_DTOA_SHORTEST,(int)&local_78,
             buffer,&local_80,in_stack_ffffffffffffff78);
  if (local_78 != 0x31) {
    pcVar1 = "\"1\"";
    pcVar3 = "1";
    uVar2 = 0x10e;
LAB_0082a4c6:
    printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n#  Expected: %s\n#  Found:    %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-bignum-dtoa.cc"
           ,uVar2,pcVar1,"buffer.start()",pcVar3,&local_78);
    abort();
  }
  if (local_80 == -0x2c) {
    buffer_00._8_8_ = local_7c;
    buffer_00.start_ = (char *)0x64;
    double_conversion::BignumDtoa
              ((double_conversion *)0x1,3.4028234663852886e+38,BIGNUM_DTOA_SHORTEST,(int)&local_78,
               buffer_00,&local_80,in_stack_ffffffffffffff78);
    if (local_70 != '\0' ||
        CONCAT17(uStack_71,
                 CONCAT16(uStack_72,
                          CONCAT24(sStack_74,CONCAT13(uStack_75,CONCAT12(uStack_76,local_78))))) !=
        0x3533323832303433) {
      pcVar1 = "\"34028235\"";
      pcVar3 = "34028235";
      uVar2 = 0x115;
      goto LAB_0082a4c6;
    }
    if (local_80 == 0x27) {
      buffer_01._8_8_ = local_7c;
      buffer_01.start_ = (char *)0x64;
      double_conversion::BignumDtoa
                ((double_conversion *)0x1,4294967296.0,BIGNUM_DTOA_SHORTEST,(int)&local_78,buffer_01
                 ,&local_80,in_stack_ffffffffffffff78);
      if (local_70 != '\0' ||
          CONCAT17(uStack_71,
                   CONCAT16(uStack_72,
                            CONCAT24(sStack_74,CONCAT13(uStack_75,CONCAT12(uStack_76,local_78)))))
          != 0x3337363934393234) {
        pcVar1 = "\"42949673\"";
        pcVar3 = "42949673";
        uVar2 = 0x11a;
        goto LAB_0082a4c6;
      }
      if (local_80 == 10) {
        buffer_02._8_8_ = local_7c;
        buffer_02.start_ = (char *)0x64;
        double_conversion::BignumDtoa
                  ((double_conversion *)0x1,3.32306998946229e+35,BIGNUM_DTOA_SHORTEST,(int)&local_78
                   ,buffer_02,&local_80,in_stack_ffffffffffffff78);
        if (CONCAT13(uStack_72,CONCAT21(sStack_74,uStack_75)) != 0x373033 ||
            CONCAT13(uStack_75,CONCAT12(uStack_76,local_78)) != 0x33323333) {
          pcVar1 = "\"332307\"";
          pcVar3 = "332307";
          uVar2 = 0x11f;
          goto LAB_0082a4c6;
        }
        if (local_80 == 0x24) {
          buffer_03._8_8_ = local_7c;
          buffer_03.start_ = (char *)0x64;
          double_conversion::BignumDtoa
                    ((double_conversion *)0x1,1.2341235575308664e-41,BIGNUM_DTOA_SHORTEST,
                     (int)&local_78,buffer_03,&local_80,in_stack_ffffffffffffff78);
          if (sStack_74 != 0x31 || CONCAT13(uStack_75,CONCAT12(uStack_76,local_78)) != 0x34333231) {
            pcVar1 = "\"12341\"";
            pcVar3 = "12341";
            uVar2 = 0x124;
            goto LAB_0082a4c6;
          }
          if (local_80 == -0x28) {
            buffer_04._8_8_ = local_7c;
            buffer_04.start_ = (char *)0x64;
            double_conversion::BignumDtoa
                      ((double_conversion *)0x1,33554432.0,BIGNUM_DTOA_SHORTEST,(int)&local_78,
                       buffer_04,&local_80,in_stack_ffffffffffffff78);
            if (local_70 != '\0' ||
                CONCAT17(uStack_71,
                         CONCAT16(uStack_72,
                                  CONCAT24(sStack_74,
                                           CONCAT13(uStack_75,CONCAT12(uStack_76,local_78))))) !=
                0x3233343435353333) {
              pcVar1 = "\"33554432\"";
              pcVar3 = "33554432";
              uVar2 = 0x129;
              goto LAB_0082a4c6;
            }
            if (local_80 == 8) {
              buffer_05._8_8_ = local_7c;
              buffer_05.start_ = (char *)0x64;
              double_conversion::BignumDtoa
                        ((double_conversion *)0x1,326494756798464.0,BIGNUM_DTOA_SHORTEST,
                         (int)&local_78,buffer_05,&local_80,in_stack_ffffffffffffff78);
              if (local_70 != '\0' ||
                  CONCAT17(uStack_71,
                           CONCAT16(uStack_72,
                                    CONCAT24(sStack_74,
                                             CONCAT13(uStack_75,CONCAT12(uStack_76,local_78))))) !=
                  0x3637343934363233) {
                pcVar1 = "\"32649476\"";
                pcVar3 = "32649476";
                uVar2 = 0x12e;
                goto LAB_0082a4c6;
              }
              if (local_80 == 0xf) {
                buffer_06._8_8_ = local_7c;
                buffer_06.start_ = (char *)0x64;
                double_conversion::BignumDtoa
                          ((double_conversion *)0x1,3.9113222363777194e+37,BIGNUM_DTOA_SHORTEST,
                           (int)&local_78,buffer_06,&local_80,in_stack_ffffffffffffff78);
                if (local_70 != '\0' ||
                    CONCAT17(uStack_71,
                             CONCAT16(uStack_72,
                                      CONCAT24(sStack_74,
                                               CONCAT13(uStack_75,CONCAT12(uStack_76,local_78)))))
                    != 0x3232323331313933) {
                  pcVar1 = "\"39113222\"";
                  pcVar3 = "39113222";
                  uVar2 = 0x133;
                  goto LAB_0082a4c6;
                }
                if (local_80 == 0x26) {
                  buffer_07._8_8_ = local_7c;
                  buffer_07.start_ = (char *)0x64;
                  double_conversion::BignumDtoa
                            ((double_conversion *)0x1,1.1754943508222875e-38,BIGNUM_DTOA_SHORTEST,
                             (int)&local_78,buffer_07,&local_80,in_stack_ffffffffffffff78);
                  if (local_70 != '\0' ||
                      CONCAT17(uStack_71,
                               CONCAT16(uStack_72,
                                        CONCAT24(sStack_74,
                                                 CONCAT13(uStack_75,CONCAT12(uStack_76,local_78)))))
                      != 0x3434393435373131) {
                    pcVar1 = "\"11754944\"";
                    pcVar3 = "11754944";
                    uVar2 = 0x139;
                    goto LAB_0082a4c6;
                  }
                  if (local_80 == -0x25) {
                    buffer_08._8_8_ = local_7c;
                    buffer_08.start_ = (char *)0x64;
                    double_conversion::BignumDtoa
                              ((double_conversion *)0x1,1.1754942106924411e-38,BIGNUM_DTOA_SHORTEST,
                               (int)&local_78,buffer_08,&local_80,in_stack_ffffffffffffff78);
                    if (local_70 != '\0' ||
                        CONCAT17(uStack_71,
                                 CONCAT16(uStack_72,
                                          CONCAT24(sStack_74,
                                                   CONCAT13(uStack_75,CONCAT12(uStack_76,local_78)))
                                         )) != 0x3234393435373131) {
                      pcVar1 = "\"11754942\"";
                      pcVar3 = "11754942";
                      uVar2 = 0x13f;
                      goto LAB_0082a4c6;
                    }
                    if (local_80 == -0x25) {
                      return;
                    }
                    uVar5 = CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),local_80);
                    uVar2 = 0x140;
                  }
                  else {
                    uVar5 = CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),local_80);
                    uVar2 = 0x13a;
                  }
                  pcVar1 = "-37";
                  uVar4 = 0xffffffdb;
                }
                else {
                  uVar5 = CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),local_80);
                  pcVar1 = "38";
                  uVar2 = 0x134;
                  uVar4 = 0x26;
                }
              }
              else {
                uVar5 = CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),local_80);
                pcVar1 = "15";
                uVar2 = 0x12f;
                uVar4 = 0xf;
              }
            }
            else {
              uVar5 = CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),local_80);
              pcVar1 = "8";
              uVar2 = 0x12a;
              uVar4 = 8;
            }
          }
          else {
            uVar5 = CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),local_80);
            pcVar1 = "-40";
            uVar2 = 0x125;
            uVar4 = 0xffffffd8;
          }
        }
        else {
          uVar5 = CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),local_80);
          pcVar1 = "36";
          uVar2 = 0x120;
          uVar4 = 0x24;
        }
      }
      else {
        uVar5 = CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),local_80);
        pcVar1 = "10";
        uVar2 = 0x11b;
        uVar4 = 10;
      }
    }
    else {
      uVar5 = CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),local_80);
      pcVar1 = "39";
      uVar2 = 0x116;
      uVar4 = 0x27;
    }
  }
  else {
    uVar5 = CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),local_80);
    pcVar1 = "-44";
    uVar2 = 0x10f;
    uVar4 = 0xffffffd4;
  }
  printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n#  Expected: %d\n#  Found:    %d\n",
         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-bignum-dtoa.cc"
         ,uVar2,pcVar1,"point",uVar4,uVar5);
  abort();
}

Assistant:

TEST(BignumDtoaShortestVariousFloats) {
  char buffer_container[kBufferSize];
  Vector<char> buffer(buffer_container, kBufferSize);
  int length;
  int point;

  float min_float = 1e-45f;
  BignumDtoa(min_float, BIGNUM_DTOA_SHORTEST_SINGLE, 0,
             buffer, &length, &point);
  CHECK_EQ("1", buffer.start());
  CHECK_EQ(-44, point);


  float max_float = 3.4028234e38f;
  BignumDtoa(max_float, BIGNUM_DTOA_SHORTEST_SINGLE, 0,
             buffer, &length, &point);
  CHECK_EQ("34028235", buffer.start());
  CHECK_EQ(39, point);

  BignumDtoa(4294967272.0f, BIGNUM_DTOA_SHORTEST_SINGLE, 0,
             buffer, &length, &point);
  CHECK_EQ("42949673", buffer.start());
  CHECK_EQ(10, point);

  BignumDtoa(3.32306998946228968226e+35f, BIGNUM_DTOA_SHORTEST_SINGLE, 0,
             buffer, &length, &point);
  CHECK_EQ("332307", buffer.start());
  CHECK_EQ(36, point);

  BignumDtoa(1.2341e-41f, BIGNUM_DTOA_SHORTEST_SINGLE, 0,
             buffer, &length, &point);
  CHECK_EQ("12341", buffer.start());
  CHECK_EQ(-40, point);

  BignumDtoa(3.3554432e7, BIGNUM_DTOA_SHORTEST_SINGLE, 0,
             buffer, &length, &point);
  CHECK_EQ("33554432", buffer.start());
  CHECK_EQ(8, point);

  BignumDtoa(3.26494756798464e14f, BIGNUM_DTOA_SHORTEST_SINGLE, 0,
             buffer, &length, &point);
  CHECK_EQ("32649476", buffer.start());
  CHECK_EQ(15, point);

  BignumDtoa(3.91132223637771935344e37f, BIGNUM_DTOA_SHORTEST_SINGLE, 0,
             buffer, &length, &point);
  CHECK_EQ("39113222", buffer.start());
  CHECK_EQ(38, point);

  uint32_t smallest_normal32 = 0x00800000;
  double v = Single(smallest_normal32).value();
  BignumDtoa(v, BIGNUM_DTOA_SHORTEST_SINGLE, 0, buffer, &length, &point);
  CHECK_EQ("11754944", buffer.start());
  CHECK_EQ(-37, point);

  uint32_t largest_denormal32 = 0x007FFFFF;
  v = Single(largest_denormal32).value();
  BignumDtoa(v, BIGNUM_DTOA_SHORTEST_SINGLE, 0, buffer, &length, &point);
  CHECK_EQ("11754942", buffer.start());
  CHECK_EQ(-37, point);
}